

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_bundle_tec(REF_INT degree,REF_INT n_control_point,REF_DBL *bundle,char *filename)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  REF_DBL *control_points;
  double t_00;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_INT nknot;
  REF_DBL *knots;
  REF_DBL uv [2];
  REF_DBL *v;
  REF_DBL *u;
  REF_DBL s1;
  REF_DBL s0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL t;
  REF_INT n;
  REF_INT i;
  char *filename_local;
  REF_DBL *bundle_local;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  iVar3 = n_control_point + degree;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x114f,
           "ref_geom_bspline_bundle_tec","unable to open file");
    n_control_point_local = 2;
  }
  else {
    fprintf(__stream,"title=\"refine bspine bundle\"\n");
    fprintf(__stream,"variables = \"u\" \"v\" \"t\"\n");
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1154
             ,"ref_geom_bspline_bundle_tec","malloc u of REF_DBL negative");
      n_control_point_local = 1;
    }
    else {
      control_points = (REF_DBL *)malloc((long)n_control_point << 3);
      if (control_points == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1154,"ref_geom_bspline_bundle_tec","malloc u of REF_DBL NULL");
        n_control_point_local = 2;
      }
      else if (n_control_point < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1155,"ref_geom_bspline_bundle_tec","malloc v of REF_DBL negative");
        n_control_point_local = 1;
      }
      else {
        uv[1] = (REF_DBL)malloc((long)n_control_point << 3);
        if ((void *)uv[1] == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1155,"ref_geom_bspline_bundle_tec","malloc v of REF_DBL NULL");
          n_control_point_local = 2;
        }
        else {
          for (t._4_4_ = 0; t._4_4_ < n_control_point; t._4_4_ = t._4_4_ + 1) {
            control_points[t._4_4_] = bundle[iVar3 + 1 + t._4_4_ * 2];
            *(REF_DBL *)((long)uv[1] + (long)t._4_4_ * 8) = bundle[iVar3 + 2 + t._4_4_ * 2];
          }
          fprintf(__stream,"zone t=\"control\", i=%d, datapacking=%s\n",(ulong)(uint)n_control_point
                  ,"point");
          for (t._4_4_ = 0; t._4_4_ < n_control_point; t._4_4_ = t._4_4_ + 1) {
            fprintf(__stream,"%f %f %f\n",control_points[t._4_4_],
                    *(undefined8 *)((long)uv[1] + (long)t._4_4_ * 8),
                    (double)t._4_4_ / (double)(n_control_point + -1));
          }
          fprintf(__stream,"zone t=\"bundle\", i=%d, datapacking=%s\n",0x3e9,"point");
          dVar1 = *bundle;
          dVar2 = bundle[iVar3];
          for (t._4_4_ = 0; t._4_4_ < 0x3e9; t._4_4_ = t._4_4_ + 1) {
            t_00 = (1.0 - (double)t._4_4_ / 1000.0) * dVar1 + ((double)t._4_4_ / 1000.0) * dVar2;
            uVar4 = ref_geom_bspline_eval
                              (degree,n_control_point,bundle,t_00,control_points,(REF_DBL *)&knots);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x116a,"ref_geom_bspline_bundle_tec",(ulong)uVar4,"eval");
              return uVar4;
            }
            uVar4 = ref_geom_bspline_eval(degree,n_control_point,bundle,t_00,(REF_DBL *)uv[1],uv);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x116c,"ref_geom_bspline_bundle_tec",(ulong)uVar4,"eval");
              return uVar4;
            }
            fprintf(__stream,"%f %f %f\n",knots,uv[0],t_00);
          }
          if (uv[1] != 0.0) {
            free((void *)uv[1]);
          }
          if (control_points != (REF_DBL *)0x0) {
            free(control_points);
          }
          fclose(__stream);
          n_control_point_local = 0;
        }
      }
    }
  }
  return n_control_point_local;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_bundle_tec(REF_INT degree,
                                               REF_INT n_control_point,
                                               REF_DBL *bundle,
                                               const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *u, *v, uv[2], *knots;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine bundle\"\n");
  fprintf(file, "variables = \"u\" \"v\" \"t\"\n");

  ref_malloc(u, n_control_point, REF_DBL);
  ref_malloc(v, n_control_point, REF_DBL);
  knots = bundle;
  for (i = 0; i < n_control_point; i++) {
    u[i] = bundle[nknot + 0 + 2 * i];
    v[i] = bundle[nknot + 1 + 2 * i];
  }
  fprintf(file, "zone t=\"control\", i=%d, datapacking=%s\n", n_control_point,
          "point");
  for (i = 0; i < n_control_point; i++) {
    t = ((REF_DBL)i / ((REF_DBL)(n_control_point - 1)));
    fprintf(file, "%f %f %f\n", u[i], v[i], t);
  }

  fprintf(file, "zone t=\"bundle\", i=%d, datapacking=%s\n", n, "point");
  t0 = knots[0];
  t1 = knots[nknot - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, u, &(uv[0])),
        "eval");
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, v, &(uv[1])),
        "eval");
    fprintf(file, "%f %f %f\n", uv[0], uv[1], t);
  }
  ref_free(v);
  ref_free(u);
  fclose(file);
  return REF_SUCCESS;
}